

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

PType * __thiscall
FTypeTable::FindType
          (FTypeTable *this,PClass *metatype,intptr_t parm1,intptr_t parm2,size_t *bucketnum)

{
  PType *this_00;
  int iVar1;
  size_t sVar2;
  PClass *pPVar3;
  PType **ppPVar4;
  
  sVar2 = Hash(metatype,parm1,parm2);
  if (bucketnum != (size_t *)0x0) {
    *bucketnum = sVar2 % 0x3fd;
  }
  ppPVar4 = this->TypeHash + sVar2 % 0x3fd;
  while( true ) {
    this_00 = *ppPVar4;
    if (this_00 == (PType *)0x0) {
      return (PType *)0x0;
    }
    pPVar3 = DObject::GetClass((DObject *)this_00);
    if ((*(PClass **)
          &pPVar3[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
           super_PType.super_PTypeBase.super_DObject == metatype) &&
       (iVar1 = (*(this_00->super_PTypeBase).super_DObject._vptr_DObject[0x13])(this_00,parm1,parm2)
       , (char)iVar1 != '\0')) break;
    ppPVar4 = &this_00->HashNext;
  }
  return this_00;
}

Assistant:

PType *FTypeTable::FindType(PClass *metatype, intptr_t parm1, intptr_t parm2, size_t *bucketnum)
{
	size_t bucket = Hash(metatype, parm1, parm2) % HASH_SIZE;
	if (bucketnum != NULL)
	{
		*bucketnum = bucket;
	}
	for (PType *type = TypeHash[bucket]; type != NULL; type = type->HashNext)
	{
		if (type->GetClass()->TypeTableType == metatype && type->IsMatch(parm1, parm2))
		{
			return type;
		}
	}
	return NULL;
}